

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O1

int plock_init(plock *plock,plock_config *config)

{
  size_t __size;
  size_t sVar1;
  int iVar2;
  plock_ops *ppVar3;
  void *pvVar4;
  long lVar5;
  plock_ops *ppVar6;
  plock_ops *ppVar7;
  byte bVar8;
  
  bVar8 = 0;
  iVar2 = -1;
  if (config != (plock_config *)0x0 && plock != (plock *)0x0) {
    ppVar3 = (plock_ops *)malloc(0x48);
    plock->ops = ppVar3;
    if (ppVar3 == (plock_ops *)0x0) {
      iVar2 = -2;
    }
    else {
      ppVar6 = config->ops;
      ppVar7 = ppVar3;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        ppVar7->init_user = ppVar6->init_user;
        ppVar6 = (plock_ops *)((long)ppVar6 + ((ulong)bVar8 * -2 + 1) * 8);
        ppVar7 = (plock_ops *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
      }
      plock->sizeof_lock_user = config->sizeof_lock_user;
      __size = config->sizeof_lock_internal;
      sVar1 = config->sizeof_range;
      plock->sizeof_lock_internal = config->sizeof_lock_internal;
      plock->sizeof_range = sVar1;
      plock->aux = config->aux;
      pvVar4 = malloc(__size);
      plock->lock = pvVar4;
      (*ppVar3->init_internal)(pvVar4);
      (plock->inactive).head = (list_elem *)0x0;
      (plock->inactive).tail = (list_elem *)0x0;
      (plock->active).head = (list_elem *)0x0;
      (plock->active).tail = (list_elem *)0x0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int plock_init(struct plock *plock, struct plock_config *config)
{
    if (!plock || !config) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    plock->ops = (struct plock_ops *)malloc(sizeof(struct plock_ops));
    if (!plock->ops) {
        return PLOCK_RESULT_ALLOC_FAIL;
    }
    *plock->ops = *(config->ops);

    // allocate and init lock
    plock->sizeof_lock_user = config->sizeof_lock_user;
    plock->sizeof_lock_internal = config->sizeof_lock_internal;
    plock->sizeof_range = config->sizeof_range;
    plock->aux = config->aux;
    plock->lock = (void *)malloc(plock->sizeof_lock_internal);
    plock->ops->init_internal(plock->lock);

    // init list and tree
    list_init(&plock->active);
    list_init(&plock->inactive);

    return PLOCK_RESULT_SUCCESS;
}